

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BPSerializer.cpp
# Opt level: O3

void __thiscall
adios2::format::BPSerializer::SerializeData(BPSerializer *this,IO *io,bool advanceStep)

{
  _func_int *p_Var1;
  _func_int **pp_Var2;
  string local_70;
  string local_50;
  
  p_Var1 = this->_vptr_BPSerializer[-3];
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"buffering","");
  profiling::IOChrono::Start((IOChrono *)(&this->field_0x278 + (long)p_Var1),&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  (*this->_vptr_BPSerializer[2])(this,io);
  pp_Var2 = this->_vptr_BPSerializer;
  if (advanceStep) {
    *(int *)(&this->field_0xe0 + (long)pp_Var2[-3]) =
         *(int *)(&this->field_0xe0 + (long)pp_Var2[-3]) + 1;
    *(long *)(&this->field_0x1d8 + (long)pp_Var2[-3]) =
         *(long *)(&this->field_0x1d8 + (long)pp_Var2[-3]) + 1;
  }
  p_Var1 = pp_Var2[-3];
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"buffering","");
  profiling::IOChrono::Stop((IOChrono *)(&this->field_0x278 + (long)p_Var1),&local_70);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  return;
}

Assistant:

void BPSerializer::SerializeData(core::IO &io, const bool advanceStep)
{
    m_Profiler.Start("buffering");
    SerializeDataBuffer(io);
    if (advanceStep)
    {
        ++m_MetadataSet.TimeStep;
        ++m_MetadataSet.CurrentStep;
    }
    m_Profiler.Stop("buffering");
}